

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_enc.c
# Opt level: O3

int WebPConfigInitInternal(WebPConfig *config,WebPPreset preset,float quality,int version)

{
  int iVar1;
  uint uVar2;
  
  if (config != (WebPConfig *)0x0 && (version & 0xffffff00U) == 0x200) {
    config->quality = quality;
    config->target_size = 0;
    config->target_PSNR = 0.0;
    config->method = 4;
    config->image_hint = WEBP_HINT_DEFAULT;
    config->segments = 4;
    config->sns_strength = 0x32;
    config->filter_strength = 0x3c;
    config->filter_sharpness = 0;
    config->qmax = 100;
    config->filter_type = 1;
    config->autofilter = 0;
    config->alpha_compression = 1;
    config->alpha_filtering = 1;
    config->alpha_quality = 100;
    config->pass = 1;
    config->show_compressed = 0;
    config->preprocessing = 0;
    config->lossless = 0;
    config->partitions = 0;
    config->partition_limit = 0;
    config->emulate_jpeg_size = 0;
    config->thread_level = 0;
    config->low_memory = 0;
    config->near_lossless = 100;
    config->exact = 0;
    config->use_delta_palette = 0;
    config->use_sharp_yuv = 0;
    config->qmin = 0;
    switch(preset) {
    case WEBP_PRESET_PICTURE:
      config->sns_strength = 0x50;
      config->filter_strength = 0x23;
      config->filter_sharpness = 4;
      iVar1 = WebPValidateConfig(config);
      return iVar1;
    case WEBP_PRESET_PHOTO:
      config->sns_strength = 0x50;
      config->filter_strength = 0x1e;
      config->filter_sharpness = 3;
      config->preprocessing = 2;
      iVar1 = WebPValidateConfig(config);
      return iVar1;
    case WEBP_PRESET_DRAWING:
      config->sns_strength = 0x19;
      config->filter_strength = 10;
      config->filter_sharpness = 6;
      iVar1 = WebPValidateConfig(config);
      return iVar1;
    case WEBP_PRESET_ICON:
      config->sns_strength = 0;
      config->filter_strength = 0;
      iVar1 = WebPValidateConfig(config);
      return iVar1;
    case WEBP_PRESET_TEXT:
      config->filter_strength = 0;
      config->segments = 2;
      config->sns_strength = 0;
      iVar1 = WebPValidateConfig(config);
      return iVar1;
    }
    uVar2 = 0;
    if ((((((((config != (WebPConfig *)0x0) && (0.0 <= config->quality)) &&
            (config->quality <= 100.0)) &&
           (((-1 < config->target_size && (0.0 < config->target_PSNR || config->target_PSNR == 0.0))
            && (((uint)config->method < 7 &&
                ((0xfffffffb < config->segments - 5U && ((uint)config->sns_strength < 0x65))))))))
          && ((uint)config->filter_strength < 0x65)) &&
         ((((uint)config->filter_sharpness < 8 && ((uint)config->filter_type < 2)) &&
          ((uint)config->autofilter < 2)))) &&
        (((0xfffffff5 < config->pass - 0xbU && (-1 < config->qmin)) &&
         ((config->qmin <= config->qmax && config->qmax < 0x65 &&
          (((uint)config->show_compressed < 2 && ((uint)config->preprocessing < 8)))))))) &&
       ((((uint)config->partitions < 4 &&
         ((((((uint)config->partition_limit < 0x65 && (-1 < config->alpha_compression)) &&
            (-1 < config->alpha_filtering)) &&
           (((uint)config->alpha_quality < 0x65 && ((uint)config->lossless < 2)))) &&
          (((uint)config->near_lossless < 0x65 &&
           ((config->image_hint < WEBP_HINT_LAST && ((uint)config->emulate_jpeg_size < 2)))))))) &&
        (((uint)config->thread_level < 2 &&
         ((((uint)config->low_memory < 2 && ((uint)config->exact < 2)) &&
          ((uint)config->use_delta_palette < 2)))))))) {
      uVar2 = (uint)((uint)config->use_sharp_yuv < 2);
    }
    return uVar2;
  }
  return 0;
}

Assistant:

int WebPConfigInitInternal(WebPConfig* config,
                           WebPPreset preset, float quality, int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_ENCODER_ABI_VERSION)) {
    return 0;   // caller/system version mismatch!
  }
  if (config == NULL) return 0;

  config->quality = quality;
  config->target_size = 0;
  config->target_PSNR = 0.;
  config->method = 4;
  config->sns_strength = 50;
  config->filter_strength = 60;   // mid-filtering
  config->filter_sharpness = 0;
  config->filter_type = 1;        // default: strong (so U/V is filtered too)
  config->partitions = 0;
  config->segments = 4;
  config->pass = 1;
  config->qmin = 0;
  config->qmax = 100;
  config->show_compressed = 0;
  config->preprocessing = 0;
  config->autofilter = 0;
  config->partition_limit = 0;
  config->alpha_compression = 1;
  config->alpha_filtering = 1;
  config->alpha_quality = 100;
  config->lossless = 0;
  config->exact = 0;
  config->image_hint = WEBP_HINT_DEFAULT;
  config->emulate_jpeg_size = 0;
  config->thread_level = 0;
  config->low_memory = 0;
  config->near_lossless = 100;
  config->use_delta_palette = 0;
  config->use_sharp_yuv = 0;

  // TODO(skal): tune.
  switch (preset) {
    case WEBP_PRESET_PICTURE:
      config->sns_strength = 80;
      config->filter_sharpness = 4;
      config->filter_strength = 35;
      config->preprocessing &= ~2;   // no dithering
      break;
    case WEBP_PRESET_PHOTO:
      config->sns_strength = 80;
      config->filter_sharpness = 3;
      config->filter_strength = 30;
      config->preprocessing |= 2;
      break;
    case WEBP_PRESET_DRAWING:
      config->sns_strength = 25;
      config->filter_sharpness = 6;
      config->filter_strength = 10;
      break;
    case WEBP_PRESET_ICON:
      config->sns_strength = 0;
      config->filter_strength = 0;   // disable filtering to retain sharpness
      config->preprocessing &= ~2;   // no dithering
      break;
    case WEBP_PRESET_TEXT:
      config->sns_strength = 0;
      config->filter_strength = 0;   // disable filtering to retain sharpness
      config->preprocessing &= ~2;   // no dithering
      config->segments = 2;
      break;
    case WEBP_PRESET_DEFAULT:
    default:
      break;
  }
  return WebPValidateConfig(config);
}